

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_astc.h
# Opt level: O2

void __thiscall
ktx::OptionsEncodeASTC::process
          (OptionsEncodeASTC *this,Options *param_1,ParseResult *args,Reporter *report)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  OptionValue *pOVar5;
  iterator iVar6;
  uint uVar7;
  long lVar8;
  undefined1 local_127;
  undefined1 local_126;
  undefined1 local_125;
  ktx_pack_astc_quality_levels_e local_124 [5];
  string qualityLevelStr;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&qualityLevelStr,kAstcQuality,(allocator<char> *)local_124);
  pOVar5 = cxxopts::ParseResult::operator[](args,&qualityLevelStr);
  sVar3 = pOVar5->m_count;
  std::__cxx11::string::~string((string *)&qualityLevelStr);
  if (sVar3 == 0) {
    uVar1 = (this->qualityLevel).min;
    uVar2 = (this->qualityLevel).max;
    uVar7 = 0x3c;
    if (uVar2 < 0x3c) {
      uVar7 = uVar2;
    }
    if (0x3c < uVar1) {
      uVar7 = uVar1;
    }
    *(this->qualityLevel).option = uVar7;
  }
  else {
    if (process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
        astc_quality_mapping_abi_cxx11_ == '\0') {
      iVar4 = __cxa_guard_acquire(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                                   astc_quality_mapping_abi_cxx11_);
      if (iVar4 != 0) {
        local_124[0] = KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
        ::pair<const_char_(&)[8],_ktx_pack_astc_quality_levels_e,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
                    *)&qualityLevelStr,(char (*) [8])"fastest",local_124);
        local_124[4] = 10;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
        ::pair<const_char_(&)[5],_ktx_pack_astc_quality_levels_e,_true>
                  (&local_e8,(char (*) [5])"fast",local_124 + 4);
        local_124[3] = 0x3c;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
        ::pair<const_char_(&)[7],_ktx_pack_astc_quality_levels_e,_true>
                  (&local_c0,(char (*) [7])"medium",local_124 + 3);
        local_124[2] = 0x62;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
        ::pair<const_char_(&)[9],_ktx_pack_astc_quality_levels_e,_true>
                  (&local_98,(char (*) [9])"thorough",local_124 + 2);
        local_124[1] = 100;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
        ::pair<const_char_(&)[11],_ktx_pack_astc_quality_levels_e,_true>
                  (&local_70,(char (*) [11])"exhaustive",local_124 + 1);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>,std::allocator<std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_Hashtable<std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>const*>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>,std::allocator<std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                       astc_quality_mapping_abi_cxx11_,&qualityLevelStr,&local_48,0,&local_125,
                   &local_126,&local_127);
        lVar8 = 0xa0;
        do {
          std::__cxx11::string::~string((string *)((long)&qualityLevelStr._M_dataplus._M_p + lVar8))
          ;
          lVar8 = lVar8 + -0x28;
        } while (lVar8 != -0x28);
        __cxa_atexit(std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
                     ::~unordered_map,
                     &process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                      astc_quality_mapping_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                             astc_quality_mapping_abi_cxx11_);
      }
    }
    captureASTCOption<std::__cxx11::string>(&local_48,this,args,kAstcQuality);
    to_lower_copy(&qualityLevelStr,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                    astc_quality_mapping_abi_cxx11_._M_h,&qualityLevelStr);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
        ._M_cur == (__node_type *)0x0) {
      Reporter::fatal_usage<char_const(&)[27],std::__cxx11::string_const&>
                (report,(char (*) [27])"Invalid astc-quality: \"{}\"",&qualityLevelStr);
    }
    uVar1 = *(uint *)((long)iVar6.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
                            ._M_cur + 0x28);
    uVar2 = (this->qualityLevel).min;
    uVar7 = (this->qualityLevel).max;
    if (uVar1 <= uVar7) {
      uVar7 = uVar1;
    }
    if (uVar1 < uVar2) {
      uVar7 = uVar2;
    }
    *(this->qualityLevel).option = uVar7;
    std::__cxx11::string::~string((string *)&qualityLevelStr);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&qualityLevelStr,kAstcPerceptual,(allocator<char> *)local_124);
  pOVar5 = cxxopts::ParseResult::operator[](args,&qualityLevelStr);
  sVar3 = pOVar5->m_count;
  std::__cxx11::string::~string((string *)&qualityLevelStr);
  if (sVar3 != 0) {
    captureASTCOption(this,kAstcPerceptual);
    (this->super_ktxAstcParams).perceptual = true;
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        if (args[kAstcQuality].count()) {
            static std::unordered_map<std::string, ktx_pack_astc_quality_levels_e> astc_quality_mapping{
                    {"fastest", KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST},
                    {"fast", KTX_PACK_ASTC_QUALITY_LEVEL_FAST},
                    {"medium", KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM},
                    {"thorough", KTX_PACK_ASTC_QUALITY_LEVEL_THOROUGH},
                    {"exhaustive", KTX_PACK_ASTC_QUALITY_LEVEL_EXHAUSTIVE}
            };
            const auto qualityLevelStr = to_lower_copy(captureASTCOption<std::string>(args, kAstcQuality));
            const auto it = astc_quality_mapping.find(qualityLevelStr);
            if (it == astc_quality_mapping.end())
                report.fatal_usage("Invalid astc-quality: \"{}\"", qualityLevelStr);
            qualityLevel = it->second;
        } else {
            qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM;
        }

        if (args[kAstcPerceptual].count()) {
            captureASTCOption(kAstcPerceptual);
            perceptual = KTX_TRUE;
        }
    }